

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O0

LY_ERR lyb_write(ly_out *out,uint8_t *buf,size_t count,lylyb_ctx *lybctx)

{
  LY_ERR LVar1;
  lyd_lyb_sibling *local_80;
  lyd_lyb_sibling *local_70;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  size_t to_write;
  lyd_lyb_sibling *iter;
  lyd_lyb_sibling *full;
  uint64_t u;
  lylyb_ctx *lybctx_local;
  size_t count_local;
  uint8_t *buf_local;
  ly_out *out_local;
  
  lybctx_local = (lylyb_ctx *)count;
  count_local = (size_t)buf;
  while( true ) {
    do {
      _ret___1 = lybctx_local;
      iter = (lyd_lyb_sibling *)0x0;
      full = (lyd_lyb_sibling *)0x0;
      while( true ) {
        if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
          local_70 = (lyd_lyb_sibling *)0x0;
        }
        else {
          local_70 = *(lyd_lyb_sibling **)&lybctx->siblings[-1].inner_chunks;
        }
        if (local_70 <= full) break;
        if (0xfffe < (long)&_ret___1->ctx + lybctx->siblings[(long)full].written) {
          _ret___1 = (lylyb_ctx *)(0xffff - lybctx->siblings[(long)full].written);
          iter = lybctx->siblings + (long)full;
        }
        full = (lyd_lyb_sibling *)((long)&full->written + 1);
      }
      if ((iter == (lyd_lyb_sibling *)0x0) && (lybctx_local == (lylyb_ctx *)0x0)) {
        return LY_SUCCESS;
      }
      if (_ret___1 != (lylyb_ctx *)0x0) {
        LVar1 = ly_write_(out,(char *)count_local,(size_t)_ret___1);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
        full = (lyd_lyb_sibling *)0x0;
        while( true ) {
          if (lybctx->siblings == (lyd_lyb_sibling *)0x0) {
            local_80 = (lyd_lyb_sibling *)0x0;
          }
          else {
            local_80 = *(lyd_lyb_sibling **)&lybctx->siblings[-1].inner_chunks;
          }
          if (local_80 <= full) break;
          lybctx->siblings[(long)full].written =
               (long)&_ret___1->ctx + lybctx->siblings[(long)full].written;
          if (0xffff < lybctx->siblings[(long)full].written) {
            __assert_fail("lybctx->siblings[u].written <= LYB_SIZE_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c"
                          ,0x131,
                          "LY_ERR lyb_write(struct ly_out *, const uint8_t *, size_t, struct lylyb_ctx *)"
                         );
          }
          full = (lyd_lyb_sibling *)((long)&full->written + 1);
        }
        lybctx_local = (lylyb_ctx *)((long)lybctx_local - (long)_ret___1);
        count_local = (long)&_ret___1->ctx + count_local;
      }
    } while (iter == (lyd_lyb_sibling *)0x0);
    LVar1 = lyb_write_sibling_meta(out,iter);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    iter->written = 0;
    iter->inner_chunks = 0;
    LVar1 = ly_write_skip(out,4,&iter->position);
    if (LVar1 != LY_SUCCESS) break;
    for (to_write = (size_t)lybctx->siblings; (lyd_lyb_sibling *)to_write != iter;
        to_write = to_write + 0x18) {
      if (*(short *)(to_write + 0x10) == -1) {
        ly_log(lybctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_lyb.c"
               ,0x146);
        return LY_EINT;
      }
      *(short *)(to_write + 0x10) = *(short *)(to_write + 0x10) + 1;
    }
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyb_write(struct ly_out *out, const uint8_t *buf, size_t count, struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;
    struct lyd_lyb_sibling *full, *iter;
    size_t to_write;

    while (1) {
        /* check for full data chunks */
        to_write = count;
        full = NULL;
        LY_ARRAY_FOR(lybctx->siblings, u) {
            /* we want the innermost chunks resolved first, so replace previous full chunks */
            if (lybctx->siblings[u].written + to_write >= LYB_SIZE_MAX) {
                /* full chunk, do not write more than allowed */
                to_write = LYB_SIZE_MAX - lybctx->siblings[u].written;
                full = &lybctx->siblings[u];
            }
        }

        if (!full && !count) {
            break;
        }

        /* we are actually writing some data, not just finishing another chunk */
        if (to_write) {
            LY_CHECK_RET(ly_write_(out, (char *)buf, to_write));

            LY_ARRAY_FOR(lybctx->siblings, u) {
                /* increase all written counters */
                lybctx->siblings[u].written += to_write;
                assert(lybctx->siblings[u].written <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= to_write;
            buf += to_write;
        }

        if (full) {
            /* write the meta information (inner chunk count and chunk size) */
            LY_CHECK_RET(lyb_write_sibling_meta(out, full));

            /* zero written and inner chunks */
            full->written = 0;
            full->inner_chunks = 0;

            /* skip space for another chunk size */
            LY_CHECK_RET(ly_write_skip(out, LYB_META_BYTES, &full->position));

            /* increase inner chunk count */
            for (iter = &lybctx->siblings[0]; iter != full; ++iter) {
                if (iter->inner_chunks == LYB_INCHUNK_MAX) {
                    LOGINT(lybctx->ctx);
                    return LY_EINT;
                }
                ++iter->inner_chunks;
            }
        }
    }

    return LY_SUCCESS;
}